

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

void __thiscall helics::Input::registerCallback(Input *this)

{
  Input *in_RDI;
  ValueFederate *unaff_retaddr;
  function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>
  *in_stack_ffffffffffffffc0;
  anon_class_8_1_8991fb9c local_28 [3];
  function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>
  *in_stack_fffffffffffffff0;
  
  std::function<void(helics::Input&,TimeRepresentation<count_time<9,long>>)>::
  function<helics::Input::registerCallback()::__0,void>(in_stack_ffffffffffffffc0,local_28);
  helics::ValueFederate::setInputNotificationCallback
            (unaff_retaddr,in_RDI,in_stack_fffffffffffffff0);
  std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>::~function
            ((function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *)0x4327d3)
  ;
  return;
}

Assistant:

void Input::registerCallback()
{
    fed->setInputNotificationCallback(*this, [this](Input& /*unused*/, Time time) {
        handleCallback(time);
    });
}